

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void whereClauseClear(WhereClause *pWC)

{
  sqlite3 *db;
  WhereOrInfo *pWC_00;
  int iVar1;
  u8 *puVar2;
  
  db = pWC->pParse->db;
  if (0 < pWC->nTerm) {
    iVar1 = pWC->nTerm + 1;
    puVar2 = &pWC->a->wtFlags;
    do {
      if ((*puVar2 & 1) != 0) {
        sqlite3ExprDelete(db,((WhereTerm *)(puVar2 + -0x1a))->pExpr);
      }
      if ((*puVar2 & 0x30) != 0) {
        pWC_00 = ((anon_union_8_3_737c4e49_for_u *)(puVar2 + -10))->pOrInfo;
        whereClauseClear(&pWC_00->wc);
        sqlite3DbFree(db,pWC_00);
      }
      iVar1 = iVar1 + -1;
      puVar2 = puVar2 + 0x38;
    } while (1 < iVar1);
  }
  if (pWC->a != pWC->aStatic) {
    sqlite3DbFree(db,pWC->a);
    return;
  }
  return;
}

Assistant:

static void whereClauseClear(WhereClause *pWC){
  int i;
  WhereTerm *a;
  sqlite3 *db = pWC->pParse->db;
  for(i=pWC->nTerm-1, a=pWC->a; i>=0; i--, a++){
    if( a->wtFlags & TERM_DYNAMIC ){
      sqlite3ExprDelete(db, a->pExpr);
    }
    if( a->wtFlags & TERM_ORINFO ){
      whereOrInfoDelete(db, a->u.pOrInfo);
    }else if( a->wtFlags & TERM_ANDINFO ){
      whereAndInfoDelete(db, a->u.pAndInfo);
    }
  }
  if( pWC->a!=pWC->aStatic ){
    sqlite3DbFree(db, pWC->a);
  }
}